

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::
to_string<std::vector<ns::book,std::allocator<ns::book>>,std::vector<ns::book,std::allocator<ns::book>>>
          (string *__return_storage_ptr__,lest *this,
          vector<ns::book,_std::allocator<ns::book>_> *lhs,string *op,
          vector<ns::book,_std::allocator<ns::book>_> *rhs)

{
  ostream *poVar1;
  vector<ns::book,_std::allocator<ns::book>_> *cont;
  vector<ns::book,_std::allocator<ns::book>_> *cont_00;
  ostringstream os;
  ForContainer<std::vector<ns::book>,_std::string> FStack_1d8;
  ForContainer<std::vector<ns::book>,_std::string> local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<std::vector<ns::book,std::allocator<ns::book>>>(&local_1b8,this,cont);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<std::vector<ns::book,std::allocator<ns::book>>>(&FStack_1d8,(lest *)op,cont_00);
  std::operator<<(poVar1,(string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&FStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}